

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_load_fpr32(DisasContext_conflict6 *ctx,TCGv_i32 t,int reg)

{
  TCGContext_conflict6 *tcg_ctx;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  if ((ctx->hflags & 0x2000000) != 0) {
    generate_exception(ctx,0x14);
  }
  tcg_gen_extrl_i64_i32_mips64el(tcg_ctx,t,tcg_ctx->fpu_f64[reg]);
  return;
}

Assistant:

static void gen_load_fpr32(DisasContext *ctx, TCGv_i32 t, int reg)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    if (ctx->hflags & MIPS_HFLAG_FRE) {
        generate_exception(ctx, EXCP_RI);
    }
    tcg_gen_extrl_i64_i32(tcg_ctx, t, tcg_ctx->fpu_f64[reg]);
}